

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O1

void __thiscall CMU462::PathTracer::stop(PathTracer *this)

{
  State SVar1;
  _Map_pointer pppBVar2;
  thread *ptVar3;
  ulong uVar4;
  
  SVar1 = this->state;
  if (SVar1 != DONE) {
    if (SVar1 != RENDERING) {
      if (SVar1 != VISUALIZE) {
        return;
      }
      while (pppBVar2 = (this->selectionHistory).c.
                        super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node,
            1 < ((long)(this->selectionHistory).c.
                       super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)(this->selectionHistory).c.
                       super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                ((long)(this->selectionHistory).c.
                       super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                 (long)(this->selectionHistory).c.
                       super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                ((((ulong)((long)pppBVar2 -
                          (long)(this->selectionHistory).c.
                                super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (ulong)(pppBVar2 == (_Map_pointer)0x0)) * 0x40) {
        std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
        ::pop_back(&(this->selectionHistory).c);
      }
      goto LAB_00183c48;
    }
    this->continueRaytracing = false;
  }
  if (this->numWorkerThreads != 0) {
    uVar4 = 0;
    do {
      std::thread::join();
      ptVar3 = (this->workerThreads).
               super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
      if (ptVar3 != (thread *)0x0) {
        if ((ptVar3->_M_id)._M_thread != 0) {
          std::terminate();
        }
        operator_delete(ptVar3,8);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->numWorkerThreads);
  }
LAB_00183c48:
  this->state = READY;
  return;
}

Assistant:

void PathTracer::stop() {
    switch (state) {
      case INIT:
      case READY:
        break;
      case VISUALIZE:
        while (selectionHistory.size() > 1) {
          selectionHistory.pop();
        }
        state = READY;
        break;
      case RENDERING:
        continueRaytracing = false;
      case DONE:
        for (int i=0; i<numWorkerThreads; i++) {
          workerThreads[i]->join();
          delete workerThreads[i];
        }
        state = READY;
        break;
    }
  }